

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_serialize_container
          (t_c_glib_generator *this,ostream *out,t_type *ttype,string *prefix,int error_ret)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  uint uVar1;
  int iVar2;
  t_type *ptVar3;
  char *pcVar4;
  ostream *poVar5;
  t_type *ptVar6;
  byte local_d42;
  byte local_a35;
  byte local_a32;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  allocator local_891;
  string local_890;
  undefined1 local_870 [8];
  string i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 local_7f0 [8];
  string length;
  string local_7b0;
  string local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  allocator local_4c9;
  undefined1 local_4c8 [8];
  string telem_ptr;
  string telem_name;
  t_type *telem;
  string local_460;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  allocator local_159;
  string local_158;
  undefined1 local_138 [8];
  string valname;
  string local_110;
  undefined1 local_f0 [8];
  string keyname;
  string tval_ptr;
  string tkey_ptr;
  undefined1 local_80 [8];
  string tval_name;
  string tkey_name;
  t_type *tval;
  t_type *tkey;
  int error_ret_local;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_c_glib_generator *this_local;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&i.field_2 + 8);
        std::operator+(__return_storage_ptr__,"(",prefix);
        std::operator+(&local_830,__return_storage_ptr__," ? ");
        std::operator+(&local_810,&local_830,prefix);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7f0,&local_810,"->len : 0)");
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_890,"i",&local_891);
        t_generator::tmp((string *)local_870,(t_generator *)this,&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        std::allocator<char>::~allocator((allocator<char> *)&local_891);
        t_generator::indent_abi_cxx11_(&local_8b8,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_8b8);
        poVar5 = std::operator<<(poVar5,"guint ");
        poVar5 = std::operator<<(poVar5,(string *)local_870);
        poVar5 = std::operator<<(poVar5,";");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_8d8,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_8d8);
        poVar5 = std::operator<<(poVar5,"if ((ret = thrift_protocol_write_list_begin (protocol, ");
        ptVar6 = t_list::get_elem_type((t_list *)ttype);
        type_to_enum_abi_cxx11_(&local_8f8,this,ptVar6);
        poVar5 = std::operator<<(poVar5,(string *)&local_8f8);
        poVar5 = std::operator<<(poVar5,", (gint32) ");
        poVar5 = std::operator<<(poVar5,(string *)local_7f0);
        poVar5 = std::operator<<(poVar5,", error)) < 0)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8d8);
        std::__cxx11::string::~string((string *)&local_8b8);
        t_generator::indent_up((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_918,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_918);
        poVar5 = std::operator<<(poVar5,"return ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_918);
        t_generator::indent_down((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_938,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_938);
        poVar5 = std::operator<<(poVar5,"xfer += ret;");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_958,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_958);
        poVar5 = std::operator<<(poVar5,"for (");
        poVar5 = std::operator<<(poVar5,(string *)local_870);
        poVar5 = std::operator<<(poVar5," = 0; ");
        poVar5 = std::operator<<(poVar5,(string *)local_870);
        poVar5 = std::operator<<(poVar5," < ");
        poVar5 = std::operator<<(poVar5,(string *)local_7f0);
        poVar5 = std::operator<<(poVar5,"; ");
        poVar5 = std::operator<<(poVar5,(string *)local_870);
        poVar5 = std::operator<<(poVar5,"++)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_938);
        t_oop_generator::scope_up(&this->super_t_oop_generator,out);
        std::__cxx11::string::string((string *)&local_978,(string *)prefix);
        std::__cxx11::string::string((string *)&local_998,(string *)local_870);
        generate_serialize_list_element(this,out,(t_list *)ttype,&local_978,&local_998,error_ret);
        std::__cxx11::string::~string((string *)&local_998);
        std::__cxx11::string::~string((string *)&local_978);
        t_oop_generator::scope_down(&this->super_t_oop_generator,out);
        t_generator::indent_abi_cxx11_(&local_9b8,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_9b8);
        poVar5 = std::operator<<(poVar5,
                                 "if ((ret = thrift_protocol_write_list_end (protocol, error)) < 0)"
                                );
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9b8);
        t_generator::indent_up((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_9d8,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_9d8);
        poVar5 = std::operator<<(poVar5,"return ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9d8);
        t_generator::indent_down((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_9f8,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_9f8);
        poVar5 = std::operator<<(poVar5,"xfer += ret;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9f8);
        std::__cxx11::string::~string((string *)local_870);
        std::__cxx11::string::~string((string *)local_7f0);
      }
    }
    else {
      ptVar6 = t_set::get_elem_type((t_set *)ttype);
      type_name_abi_cxx11_((string *)((long)&telem_ptr.field_2 + 8),this,ptVar6,false,false);
      uVar1 = (*(ptVar6->super_t_doc)._vptr_t_doc[6])();
      local_d42 = 1;
      if ((uVar1 & 1) == 0) {
        iVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[5])();
        local_d42 = (byte)iVar2 ^ 0xff;
      }
      pcVar4 = "*";
      if ((local_d42 & 1) != 0) {
        pcVar4 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_4c8,pcVar4,&local_4c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_4f0);
      poVar5 = std::operator<<(poVar5,"GList *key_list = NULL, *iter = NULL;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_510);
      poVar5 = std::operator<<(poVar5,(string *)(telem_ptr.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,(string *)local_4c8);
      poVar5 = std::operator<<(poVar5,"* keys;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_530);
      poVar5 = std::operator<<(poVar5,"int i = 0, key_count;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_550);
      poVar5 = std::operator<<(poVar5,(string *)(telem_ptr.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,(string *)local_4c8);
      poVar5 = std::operator<<(poVar5," elem;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_570,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_570);
      poVar5 = std::operator<<(poVar5,"gpointer value;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_590,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_590);
      poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (value);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_5b0);
      poVar5 = std::operator<<(poVar5,"if ((ret = thrift_protocol_write_set_begin (protocol, ");
      type_to_enum_abi_cxx11_(&local_5d0,this,ptVar6);
      poVar5 = std::operator<<(poVar5,(string *)&local_5d0);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,(string *)prefix);
      poVar5 = std::operator<<(poVar5," ? ");
      poVar5 = std::operator<<(poVar5,"(gint32) g_hash_table_size ((GHashTable *) ");
      poVar5 = std::operator<<(poVar5,(string *)prefix);
      poVar5 = std::operator<<(poVar5,") : 0");
      poVar5 = std::operator<<(poVar5,", error)) < 0)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4f0);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_5f0);
      poVar5 = std::operator<<(poVar5,"return ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5f0);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_610);
      poVar5 = std::operator<<(poVar5,"xfer += ret;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_630,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_630);
      poVar5 = std::operator<<(poVar5,"if (");
      poVar5 = std::operator<<(poVar5,(string *)prefix);
      poVar5 = std::operator<<(poVar5,")");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_650,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_650);
      poVar5 = std::operator<<(poVar5,"  g_hash_table_foreach ((GHashTable *) ");
      poVar5 = std::operator<<(poVar5,(string *)prefix);
      poVar5 = std::operator<<(poVar5,", thrift_hash_table_get_keys, &key_list);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_670,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_670);
      poVar5 = std::operator<<(poVar5,"key_count = g_list_length (key_list);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_690,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_690);
      poVar5 = std::operator<<(poVar5,"keys = g_newa (");
      poVar5 = std::operator<<(poVar5,(string *)(telem_ptr.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,(string *)local_4c8);
      poVar5 = std::operator<<(poVar5,", key_count);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_6b0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_6b0);
      poVar5 = std::operator<<(poVar5,
                               "for (iter = g_list_first (key_list); iter; iter = iter->next)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_610);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_6d0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_6d0);
      poVar5 = std::operator<<(poVar5,"keys[i++] = (");
      poVar5 = std::operator<<(poVar5,(string *)(telem_ptr.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,(string *)local_4c8);
      poVar5 = std::operator<<(poVar5,") iter->data;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_6d0);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_6f0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_6f0);
      poVar5 = std::operator<<(poVar5,"g_list_free (key_list);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_710,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_710);
      poVar5 = std::operator<<(poVar5,"for (i = 0; i < key_count; ++i)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_710);
      std::__cxx11::string::~string((string *)&local_6f0);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_730,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_730);
      poVar5 = std::operator<<(poVar5,"elem = keys[i];");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_750,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_750);
      poVar5 = std::operator<<(poVar5,"value = (gpointer) g_hash_table_lookup (((GHashTable *) ");
      poVar5 = std::operator<<(poVar5,(string *)prefix);
      poVar5 = std::operator<<(poVar5,"), (gpointer) elem);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_730);
      std::operator+(&local_770,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                     "elem");
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_770,error_ret);
      std::__cxx11::string::~string((string *)&local_770);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_790,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_790);
      poVar5 = std::operator<<(poVar5,
                               "if ((ret = thrift_protocol_write_set_end (protocol, error)) < 0)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_790);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_7b0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_7b0);
      poVar5 = std::operator<<(poVar5,"return ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_7b0);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_((string *)((long)&length.field_2 + 8),(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)(length.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,"xfer += ret;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)(length.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_4c8);
      std::__cxx11::string::~string((string *)(telem_ptr.field_2._M_local_buf + 8));
    }
  }
  else {
    ptVar6 = t_map::get_key_type((t_map *)ttype);
    ptVar3 = t_map::get_val_type((t_map *)ttype);
    type_name_abi_cxx11_((string *)((long)&tval_name.field_2 + 8),this,ptVar6,false,false);
    type_name_abi_cxx11_((string *)local_80,this,ptVar3,false,false);
    std::__cxx11::string::string((string *)(tval_ptr.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(keyname.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,"key",(allocator *)(valname.field_2._M_local_buf + 0xf));
    t_generator::tmp((string *)local_f0,(t_generator *)this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)(valname.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"val",&local_159);
    t_generator::tmp((string *)local_138,(t_generator *)this,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    declore_local_variable_for_write(this,out,ptVar6,(string *)local_f0);
    declore_local_variable_for_write(this,out,ptVar3,(string *)local_138);
    ptVar6 = t_generator::get_true_type(ptVar6);
    ptVar3 = t_generator::get_true_type(ptVar3);
    uVar1 = (*(ptVar6->super_t_doc)._vptr_t_doc[6])();
    local_a32 = 1;
    if ((uVar1 & 1) == 0) {
      iVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[5])();
      local_a32 = (byte)iVar2 ^ 0xff;
    }
    pcVar4 = "*";
    if ((local_a32 & 1) != 0) {
      pcVar4 = "";
    }
    std::__cxx11::string::operator=((string *)(tval_ptr.field_2._M_local_buf + 8),pcVar4);
    uVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[6])();
    local_a35 = 1;
    if ((uVar1 & 1) == 0) {
      iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])();
      local_a35 = (byte)iVar2 ^ 0xff;
    }
    pcVar4 = "*";
    if ((local_a35 & 1) != 0) {
      pcVar4 = "";
    }
    std::__cxx11::string::operator=((string *)(keyname.field_2._M_local_buf + 8),pcVar4);
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_180);
    poVar5 = std::operator<<(poVar5,"GList *key_list = NULL, *iter = NULL;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_1a0);
    poVar5 = std::operator<<(poVar5,(string *)(tval_name.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,(string *)(tval_ptr.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"* keys;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    poVar5 = std::operator<<(poVar5,"int i = 0, key_count;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_1e0);
    poVar5 = std::operator<<(poVar5,"if ((ret = thrift_protocol_write_map_begin (protocol, ");
    type_to_enum_abi_cxx11_(&local_200,this,ptVar6);
    poVar5 = std::operator<<(poVar5,(string *)&local_200);
    poVar5 = std::operator<<(poVar5,", ");
    type_to_enum_abi_cxx11_(&local_220,this,ptVar3);
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5," ? ");
    poVar5 = std::operator<<(poVar5,"(gint32) g_hash_table_size ((GHashTable *) ");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5,") : 0");
    poVar5 = std::operator<<(poVar5,", error)) < 0)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"return ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_240);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_260,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_260);
    poVar5 = std::operator<<(poVar5,"xfer += ret;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_280);
    poVar5 = std::operator<<(poVar5,"if (");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5,")");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_2a0);
    poVar5 = std::operator<<(poVar5,"  g_hash_table_foreach ((GHashTable *) ");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5,", thrift_hash_table_get_keys, &key_list);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_2c0);
    poVar5 = std::operator<<(poVar5,"key_count = g_list_length (key_list);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_2e0);
    poVar5 = std::operator<<(poVar5,"keys = g_newa (");
    poVar5 = std::operator<<(poVar5,(string *)(tval_name.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,(string *)(tval_ptr.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,", key_count);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_300,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_300);
    poVar5 = std::operator<<(poVar5,"for (iter = g_list_first (key_list); iter; iter = iter->next)")
    ;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_320);
    poVar5 = std::operator<<(poVar5,"keys[i++] = (");
    poVar5 = std::operator<<(poVar5,(string *)(tval_name.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,(string *)(tval_ptr.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,") iter->data;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_320);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_340);
    poVar5 = std::operator<<(poVar5,"g_list_free (key_list);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_360);
    poVar5 = std::operator<<(poVar5,"for (i = 0; i < key_count; ++i)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_380);
    poVar5 = std::operator<<(poVar5,(string *)local_f0);
    poVar5 = std::operator<<(poVar5," = keys[i];");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_3a0);
    poVar5 = std::operator<<(poVar5,(string *)local_138);
    poVar5 = std::operator<<(poVar5," = (");
    poVar5 = std::operator<<(poVar5,(string *)local_80);
    poVar5 = std::operator<<(poVar5,(string *)(keyname.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,") g_hash_table_lookup (((GHashTable *) ");
    poVar5 = std::operator<<(poVar5,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"), (gpointer) ");
    poVar5 = std::operator<<(poVar5,(string *)local_f0);
    poVar5 = std::operator<<(poVar5,");");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::operator+(&local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tval_ptr.field_2 + 8)," ");
    std::operator+(&local_3c0,&local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    std::operator+(&local_420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&keyname.field_2 + 8)," ");
    std::operator+(&local_400,&local_420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_3c0,&local_400,error_ret);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_440);
    poVar5 = std::operator<<(poVar5,
                             "if ((ret = thrift_protocol_write_map_end (protocol, error)) < 0)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_440);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_460,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_460);
    poVar5 = std::operator<<(poVar5,"return ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_460);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_((string *)&telem,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&telem);
    poVar5 = std::operator<<(poVar5,"xfer += ret;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&telem);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(keyname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(tval_ptr.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(tval_name.field_2._M_local_buf + 8));
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_container(ostream& out,
                                                      t_type* ttype,
                                                      string prefix,
                                                      int error_ret) {
  scope_up(out);

  if (ttype->is_map()) {
    t_type* tkey = ((t_map*)ttype)->get_key_type();
    t_type* tval = ((t_map*)ttype)->get_val_type();
    string tkey_name = type_name(tkey);
    string tval_name = type_name(tval);
    string tkey_ptr;
    string tval_ptr;
    string keyname = tmp("key");
    string valname = tmp("val");

    declore_local_variable_for_write(out, tkey, keyname);
    declore_local_variable_for_write(out, tval, valname);

    /* If either the key or value type is a typedef, find its underlying type so
       we can correctly determine how to generate a pointer to it */
    tkey = get_true_type(tkey);
    tval = get_true_type(tval);

    tkey_ptr = tkey->is_string() || !tkey->is_base_type() ? "" : "*";
    tval_ptr = tval->is_string() || !tval->is_base_type() ? "" : "*";

    /*
     * Some ugliness here.  To maximize backwards compatibility, we
     * avoid using GHashTableIter and instead get a GList of all keys,
     * then copy it into a array on the stack, and free it.
     * This is because we may exit early before we get a chance to free the
     * GList.
     */
    out << indent() << "GList *key_list = NULL, *iter = NULL;" << endl
        << indent() << tkey_name << tkey_ptr << "* keys;" << endl
        << indent() << "int i = 0, key_count;" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_map_begin (protocol, "
        << type_to_enum(tkey) << ", " << type_to_enum(tval) << ", " << prefix << " ? "
        << "(gint32) g_hash_table_size ((GHashTable *) " << prefix << ") : 0"
        << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "if (" << prefix << ")" << endl
        << indent() << "  g_hash_table_foreach ((GHashTable *) " << prefix
        << ", thrift_hash_table_get_keys, &key_list);" << endl
        << indent() << "key_count = g_list_length (key_list);" << endl
        << indent() << "keys = g_newa (" << tkey_name << tkey_ptr
        << ", key_count);" << endl
        << indent() << "for (iter = g_list_first (key_list); iter; "
           "iter = iter->next)" << endl;
    indent_up();
    out << indent() << "keys[i++] = (" << tkey_name << tkey_ptr
        << ") iter->data;" << endl;
    indent_down();
    out << indent() << "g_list_free (key_list);" << endl
        << endl
        << indent() << "for (i = 0; i < key_count; ++i)" << endl;
    scope_up(out);
    out << indent() << keyname << " = keys[i];" << endl
        << indent() << valname << " = (" << tval_name << tval_ptr
        << ") g_hash_table_lookup (((GHashTable *) " << prefix
        << "), (gpointer) " << keyname << ");" << endl
        << endl;
    generate_serialize_map_element(out,
                                   (t_map*)ttype,
                                   tkey_ptr + " " + keyname,
                                   tval_ptr + " " + valname,
                                   error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_map_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  } else if (ttype->is_set()) {
    t_type* telem = ((t_set*)ttype)->get_elem_type();
    string telem_name = type_name(telem);
    string telem_ptr = telem->is_string() || !telem->is_base_type() ? "" : "*";
    out << indent() << "GList *key_list = NULL, *iter = NULL;" << endl
        << indent() << telem_name << telem_ptr << "* keys;" << endl
        << indent() << "int i = 0, key_count;" << endl
        << indent() << telem_name << telem_ptr << " elem;" << endl
        << indent() << "gpointer value;" << endl
        << indent() << "THRIFT_UNUSED_VAR (value);" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_set_begin (protocol, "
        << type_to_enum(telem) << ", " << prefix << " ? "
        << "(gint32) g_hash_table_size ((GHashTable *) " << prefix << ") : 0"
        << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "if (" << prefix << ")" << endl
        << indent() << "  g_hash_table_foreach ((GHashTable *) " << prefix
        << ", thrift_hash_table_get_keys, &key_list);" << endl
        << indent() << "key_count = g_list_length (key_list);" << endl
        << indent() << "keys = g_newa (" << telem_name << telem_ptr
        << ", key_count);" << endl
        << indent() << "for (iter = g_list_first (key_list); iter; "
           "iter = iter->next)" << endl;
    indent_up();
    out << indent() << "keys[i++] = (" << telem_name << telem_ptr
        << ") iter->data;" << endl;
    indent_down();
    out << indent() << "g_list_free (key_list);" << endl
        << endl
        << indent() << "for (i = 0; i < key_count; ++i)" << endl;
    scope_up(out);
    out << indent() << "elem = keys[i];" << endl
        << indent() << "value = (gpointer) g_hash_table_lookup "
           "(((GHashTable *) " << prefix << "), (gpointer) elem);" << endl
        << endl;
    generate_serialize_set_element(out,
                                   (t_set*)ttype,
                                   telem_ptr + "elem",
                                   error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_set_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  } else if (ttype->is_list()) {
    string length = "(" + prefix + " ? " + prefix + "->len : 0)";
    string i = tmp("i");
    out << indent() << "guint " << i << ";" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_list_begin (protocol, "
        << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", (gint32) "
        << length << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "for (" << i << " = 0; " << i << " < " << length << "; "
        << i << "++)" << endl;
    scope_up(out);
    generate_serialize_list_element(out, (t_list*)ttype, prefix, i, error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_list_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  }

  scope_down(out);
}